

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

HFSubWorker * __thiscall
MlmWrap::createWorkerSub
          (MlmWrap *this,HighFreqDataType *dt,int numThreads,hfs_data_callback_fn userFoo,void *args
          )

{
  SubType SVar1;
  HFSubWorker *this_00;
  undefined8 in_RSI;
  hfs_data_callback_fn in_RDI;
  HFSubSockSettings sockInfo;
  HFSubWorker *newSub;
  HighFreqSub *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  SubType type;
  HFSubWorker *hf;
  HFSubSockSettings *in_stack_fffffffffffffd50;
  HighFreqDataType *in_stack_fffffffffffffd58;
  HighFreqDataType *in_stack_fffffffffffffd60;
  void *in_stack_fffffffffffffdd0;
  hfs_data_callback_fn in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  HighFreqDataType *in_stack_fffffffffffffde8;
  HFSubWorker *in_stack_fffffffffffffdf0;
  HFSubSockSettings *in_stack_fffffffffffffe30;
  MlmWrap *in_stack_fffffffffffffe38;
  
  type = (SubType)((ulong)in_RSI >> 0x20);
  this_00 = (HFSubWorker *)operator_new(0xf0);
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  HFSubWorker::HFSubWorker
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  HighFreqDataType::~HighFreqDataType
            ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  hf = this_00;
  addSubToList((MlmWrap *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28);
  HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  SVar1 = HighFreqSub::getSubSockType(&this_00->super_HighFreqSub);
  HFSubSockSettings::HFSubSockSettings
            (in_stack_fffffffffffffd50,(HighFreqDataType *)hf,type,in_RDI,
             (void *)CONCAT44(SVar1,in_stack_fffffffffffffd30));
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)CONCAT44(SVar1,in_stack_fffffffffffffd30))
  ;
  HFSubSockSettings::HFSubSockSettings
            ((HFSubSockSettings *)CONCAT44(SVar1,in_stack_fffffffffffffd30),
             (HFSubSockSettings *)in_stack_fffffffffffffd28);
  addHfTypeToSubbedList(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x369b76);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x369b8f);
  return this_00;
}

Assistant:

HFSubWorker* MlmWrap::createWorkerSub(HighFreqDataType dt, int numThreads, hfs_data_callback_fn userFoo, void *args) {
    HFSubWorker *newSub = new HFSubWorker(dt, numThreads, userFoo, args);
    addSubToList(newSub);
    HFSubSockSettings sockInfo(dt, newSub->getSubSockType(), userFoo, args);
    addHfTypeToSubbedList(sockInfo);
    //todo: add a check to see if newSub was created properly, if not, don't add the type to the subbedList

    return(newSub);
}